

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::TextFlow::Column::iterator::iterator(iterator *this,Column *column)

{
  bool bVar1;
  long in_RSI;
  long *in_RDI;
  iterator *in_stack_00000010;
  
  *in_RDI = in_RSI;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  *(undefined1 *)(in_RDI + 5) = 0;
  if (*(ulong *)(*in_RDI + 0x18) <= *(ulong *)(*in_RDI + 0x20)) {
    __assert_fail("m_column.m_width > m_column.m_indent",
                  "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
                  ,0x217c,"Catch::clara::TextFlow::Column::iterator::iterator(const Column &)");
  }
  bVar1 = true;
  if (*(long *)(*in_RDI + 0x28) != -1) {
    bVar1 = *(ulong *)(*in_RDI + 0x28) < *(ulong *)(*in_RDI + 0x18);
  }
  if (!bVar1) {
    __assert_fail("m_column.m_initialIndent == std::string::npos || m_column.m_width > m_column.m_initialIndent"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
                  ,0x217d,"Catch::clara::TextFlow::Column::iterator::iterator(const Column &)");
  }
  calcLength(in_stack_00000010);
  if (in_RDI[3] == 0) {
    in_RDI[1] = in_RDI[1] + 1;
  }
  return;
}

Assistant:

explicit iterator(Column const& column) : m_column(column) {
			assert(m_column.m_width > m_column.m_indent);
			assert(m_column.m_initialIndent == std::string::npos || m_column.m_width > m_column.m_initialIndent);
			calcLength();
			if (m_len == 0)
				m_stringIndex++; // Empty string
		}